

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

unsigned_long __thiscall gimage::Histogram::sumAll(Histogram *this)

{
  int i;
  int k;
  unsigned_long ret;
  Histogram *this_local;
  
  ret = 0;
  for (k = 0; k < *(int *)(this + 4); k = k + 1) {
    for (i = 0; i < *(int *)this; i = i + 1) {
      ret = *(long *)(*(long *)(*(long *)(this + 0x18) + (long)k * 8) + (long)i * 8) + ret;
    }
  }
  return ret;
}

Assistant:

unsigned long Histogram::sumAll() const
{
  unsigned long ret=0;

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      ret+=row[k][i];
    }
  }

  return ret;
}